

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O3

int check_in_range(unsigned_long value,unsigned_long check_value_data)

{
  bool bVar1;
  bool bVar2;
  
  if (check_value_data != 0) {
    bVar1 = *(ulong *)(check_value_data + 0x28) <= value;
    bVar2 = value <= *(ulong *)(check_value_data + 0x30);
    if (!bVar1 || !bVar2) {
      cm_print_error("%lu is not within the range %lu-%lu\n",value);
    }
    return (uint)(bVar1 && bVar2);
  }
  cm_print_error("%s\n","check_integer_range");
  _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O3/_deps/cmocka-src/src/cmocka.c"
        ,0x5a5);
}

Assistant:

static int check_in_range(const LargestIntegralType value,
                          const LargestIntegralType check_value_data) {
    CheckIntegerRange * const check_integer_range =
        cast_largest_integral_type_to_pointer(CheckIntegerRange*,
                                              check_value_data);
    assert_non_null(check_integer_range);
    return integer_in_range_display_error(value, check_integer_range->minimum,
                                          check_integer_range->maximum);
}